

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  Option *pOVar9;
  long lVar10;
  void *in_R8;
  long lVar11;
  Mat local_78;
  
  iVar7 = -1;
  if (this->support_inplace == true) {
    pOVar9 = opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    iVar7 = (int)((ulong)((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 6);
    bVar6 = 0 < iVar7;
    if (0 < iVar7) {
      lVar11 = 0;
      lVar10 = 0;
      do {
        Mat::clone(&local_78,
                   (__fn *)((long)&((bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->data + lVar11),
                   opt->blob_allocator,(int)pOVar9,in_R8);
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar1 = (Mat *)((long)&pMVar3->data + lVar11);
        if (pMVar1 != &local_78) {
          piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = *(int **)((long)&pMVar3->refcount + lVar11);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              __ptr = *(void **)((long)&pMVar3->data + lVar11);
              plVar5 = *(long **)((long)&pMVar3->allocator + lVar11);
              if (plVar5 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          pMVar1->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)&pMVar3->dims + lVar11);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)&pMVar3->cstep + lVar11) = 0;
          puVar2 = (undefined8 *)((long)&pMVar3->data + lVar11);
          *puVar2 = local_78.data;
          puVar2[1] = CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          *(ulong *)((long)&pMVar3->elemsize + lVar11) =
               CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
          *(int *)((long)&pMVar3->elempack + lVar11) = local_78.elempack;
          *(Allocator **)((long)&pMVar3->allocator + lVar11) = local_78.allocator;
          piVar4 = (int *)((long)&pMVar3->dims + lVar11);
          *piVar4 = local_78.dims;
          piVar4[1] = local_78.w;
          piVar4[2] = local_78.h;
          piVar4[3] = local_78.c;
          *(size_t *)((long)&pMVar3->cstep + lVar11) = local_78.cstep;
        }
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (**(code **)(*(long *)local_78.allocator + 0x18))();
            }
          }
        }
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((*(long *)((long)&pMVar3->data + lVar11) == 0) ||
           (pOVar9 = (Option *)
                     ((long)*(int *)((long)&pMVar3->c + lVar11) *
                     *(long *)((long)&pMVar3->cstep + lVar11)), pOVar9 == (Option *)0x0)) {
          if (bVar6) {
            return -100;
          }
          break;
        }
        lVar10 = lVar10 + 1;
        lVar8 = (long)(int)((ulong)((long)(top_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(top_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_start) >> 6);
        lVar11 = lVar11 + 0x40;
        bVar6 = lVar10 < lVar8;
      } while (lVar10 < lVar8);
    }
    iVar7 = (*this->_vptr_Layer[8])(this,top_blobs,opt);
  }
  return iVar7;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}